

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_join_comm(REF_MPI split_mpi)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_join_comm(REF_MPI split_mpi) {
#ifdef HAVE_MPI
  MPI_Comm_free(&ref_mpi_comm(split_mpi));
#else
  SUPRESS_UNUSED_COMPILER_WARNING(split_mpi);
#endif
  return REF_SUCCESS;
}